

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

void rename_cb(uv_fs_t *req)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_fs_t *loop;
  char *pcVar3;
  uv_file add_flags;
  int add_flags_00;
  uv_fs_t *puVar4;
  char *unaff_R12;
  uv_fs_t *unaff_R14;
  uv_dirent_t *unaff_R15;
  uv_buf_t uVar5;
  uv_dirent_t dent;
  uv_dirent_t dent_00;
  uv_dirent_t uStackY_c8;
  uv_loop_t *puStackY_b8;
  char *pcStackY_b0;
  uv_fs_t *puStackY_a0;
  code *pcStackY_98;
  code *pcStackY_90;
  uv_dirent_t uStackY_88;
  char *pcStackY_78;
  
  if (req == &rename_req) {
    if (rename_req.fs_type != UV_FS_RENAME) goto LAB_00150786;
    if (rename_req.result == 0) {
      rename_cb_count = rename_cb_count + 1;
      uv_fs_req_cleanup(&rename_req);
      return;
    }
  }
  else {
    rename_cb_cold_1();
LAB_00150786:
    rename_cb_cold_2();
  }
  rename_cb_cold_3();
  if (req == &open_req1) {
    if (open_req1.fs_type != UV_FS_OPEN) goto LAB_00150877;
    add_flags = (uv_file)open_req1.result;
    if (open_req1.result._4_4_ < 0) goto LAB_0015087c;
    open_cb_count = open_cb_count + 1;
    if (open_req1.path == (char *)0x0) goto LAB_00150881;
    if (*(long *)(open_req1.path + 3) != 0x32656c69665f74 ||
        *(long *)open_req1.path != 0x6c69665f74736574) goto LAB_00150886;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    iov = uv_buf_init(buf,0x20);
    puVar2 = ::loop;
    iVar1 = uv_fs_read(::loop,&read_req,(uv_file)open_req1.result,&iov,1,-1,read_cb);
    add_flags = (uv_file)puVar2;
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    open_cb_cold_1();
LAB_00150877:
    add_flags = (uv_file)req;
    open_cb_cold_2();
LAB_0015087c:
    open_cb_cold_6();
LAB_00150881:
    open_cb_cold_5();
LAB_00150886:
    open_cb_cold_3();
  }
  open_cb_cold_4();
  fs_file_sync(add_flags);
  fs_file_sync(add_flags);
  puVar2 = uv_default_loop();
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  uv_run(puVar2,UV_RUN_DEFAULT);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 == 0) {
    return;
  }
  run_test_fs_file_sync_cold_1();
  unlink("test_file");
  unlink("test_file2");
  puVar2 = uv_default_loop();
  ::loop = puVar2;
  iVar1 = uv_fs_open(puVar2,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  add_flags_00 = (int)puVar2;
  if (iVar1 < 0) {
    fs_file_sync_cold_1();
LAB_00150cdf:
    fs_file_sync_cold_2();
LAB_00150ce4:
    fs_file_sync_cold_3();
LAB_00150ce9:
    fs_file_sync_cold_4();
LAB_00150cee:
    fs_file_sync_cold_5();
LAB_00150cf3:
    fs_file_sync_cold_6();
LAB_00150cf8:
    fs_file_sync_cold_7();
LAB_00150cfd:
    fs_file_sync_cold_8();
LAB_00150d02:
    fs_file_sync_cold_9();
LAB_00150d07:
    fs_file_sync_cold_10();
LAB_00150d0c:
    fs_file_sync_cold_11();
LAB_00150d11:
    fs_file_sync_cold_12();
LAB_00150d16:
    fs_file_sync_cold_13();
LAB_00150d1b:
    fs_file_sync_cold_14();
LAB_00150d20:
    fs_file_sync_cold_15();
LAB_00150d25:
    fs_file_sync_cold_16();
LAB_00150d2a:
    fs_file_sync_cold_17();
LAB_00150d2f:
    fs_file_sync_cold_18();
LAB_00150d34:
    fs_file_sync_cold_19();
LAB_00150d39:
    fs_file_sync_cold_20();
LAB_00150d3e:
    fs_file_sync_cold_21();
LAB_00150d43:
    fs_file_sync_cold_22();
LAB_00150d48:
    fs_file_sync_cold_23();
LAB_00150d4d:
    fs_file_sync_cold_24();
LAB_00150d52:
    fs_file_sync_cold_25();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00150cdf;
    uv_fs_req_cleanup(&open_req1);
    uVar5 = uv_buf_init(test_buf,0xd);
    add_flags_00 = 0;
    iov = uVar5;
    iVar1 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_00150ce4;
    if (write_req.result < 0) goto LAB_00150ce9;
    uv_fs_req_cleanup(&write_req);
    add_flags_00 = 0;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00150cee;
    if (close_req.result != 0) goto LAB_00150cf3;
    uv_fs_req_cleanup(&close_req);
    add_flags_00 = 0;
    iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",2,0,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_00150cf8;
    if (open_req1.result._4_4_ < 0) goto LAB_00150cfd;
    uv_fs_req_cleanup(&open_req1);
    uVar5 = uv_buf_init(buf,0x20);
    add_flags_00 = 0;
    iov = uVar5;
    iVar1 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar1 < 0) goto LAB_00150d02;
    if (read_req.result < 0) goto LAB_00150d07;
    add_flags_00 = 0x2fbca0;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_00150d0c;
    uv_fs_req_cleanup(&read_req);
    add_flags_00 = 0;
    iVar1 = uv_fs_ftruncate((uv_loop_t *)0x0,&ftruncate_req,(uv_file)open_req1.result,7,
                            (uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00150d11;
    if (ftruncate_req.result != 0) goto LAB_00150d16;
    uv_fs_req_cleanup(&ftruncate_req);
    add_flags_00 = 0;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00150d1b;
    if (close_req.result != 0) goto LAB_00150d20;
    uv_fs_req_cleanup(&close_req);
    add_flags_00 = 0;
    iVar1 = uv_fs_rename((uv_loop_t *)0x0,&rename_req,"test_file","test_file2",(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00150d25;
    if (rename_req.result != 0) goto LAB_00150d2a;
    uv_fs_req_cleanup(&rename_req);
    add_flags_00 = 0;
    iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file2",0,0,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_00150d2f;
    if (open_req1.result._4_4_ < 0) goto LAB_00150d34;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar5 = uv_buf_init(buf,0x20);
    add_flags_00 = 0;
    iov = uVar5;
    iVar1 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar1 < 0) goto LAB_00150d39;
    if (read_req.result < 0) goto LAB_00150d3e;
    if (buf._0_8_ != 0x75622d74736574) goto LAB_00150d43;
    uv_fs_req_cleanup(&read_req);
    add_flags_00 = 0;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00150d48;
    if (close_req.result != 0) goto LAB_00150d4d;
    uv_fs_req_cleanup(&close_req);
    add_flags_00 = 0;
    iVar1 = uv_fs_unlink((uv_loop_t *)0x0,&unlink_req,"test_file2",(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00150d52;
    if (unlink_req.result == 0) {
      uv_fs_req_cleanup(&unlink_req);
      unlink("test_file");
      unlink("test_file2");
      return;
    }
  }
  fs_file_sync_cold_26();
  fs_file_write_null_buffer(add_flags_00);
  fs_file_write_null_buffer(add_flags_00);
  puVar2 = uv_default_loop();
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  uv_run(puVar2,UV_RUN_DEFAULT);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 == 0) {
    return;
  }
  run_test_fs_file_write_null_buffer_cold_1();
  unlink("test_file");
  ::loop = uv_default_loop();
  iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar1 < 0) {
    fs_file_write_null_buffer_cold_1();
LAB_00150eac:
    fs_file_write_null_buffer_cold_2();
LAB_00150eb1:
    fs_file_write_null_buffer_cold_3();
LAB_00150eb6:
    fs_file_write_null_buffer_cold_4();
LAB_00150ebb:
    fs_file_write_null_buffer_cold_5();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00150eac;
    uv_fs_req_cleanup(&open_req1);
    uVar5 = uv_buf_init((char *)0x0,0);
    iov = uVar5;
    iVar1 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00150eb1;
    if (write_req.result != 0) goto LAB_00150eb6;
    uv_fs_req_cleanup(&write_req);
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00150ebb;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      return;
    }
  }
  fs_file_write_null_buffer_cold_6();
  pcStackY_78 = "test_file";
  pcStackY_90 = (code *)0x150ede;
  unlink("test_dir/file1");
  pcStackY_90 = (code *)0x150eea;
  unlink("test_dir/file2");
  puVar2 = (uv_loop_t *)0x194437;
  pcStackY_90 = (code *)0x150ef9;
  rmdir("test_dir");
  pcStackY_90 = (code *)0x150efe;
  loop = (uv_fs_t *)uv_default_loop();
  pcStackY_90 = (code *)0x150f23;
  ::loop = (uv_loop_t *)loop;
  iVar1 = uv_fs_mkdir((uv_loop_t *)loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar1 == 0) {
    pcStackY_90 = (code *)0x150f39;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (mkdir_cb_count != 1) goto LAB_00151341;
    loop = (uv_fs_t *)0x0;
    pcStackY_90 = (code *)0x150f69;
    iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_dir/file1",0x41,0x180,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_00151346;
    pcStackY_90 = (code *)0x150f7d;
    uv_fs_req_cleanup(&open_req1);
    loop = (uv_fs_t *)0x0;
    pcStackY_90 = (code *)0x150f93;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_0015134b;
    pcStackY_90 = (code *)0x150fa7;
    uv_fs_req_cleanup(&close_req);
    loop = (uv_fs_t *)0x0;
    pcStackY_90 = (code *)0x150fca;
    iVar1 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_dir/file2",0x41,0x180,(uv_fs_cb)0x0);
    if (iVar1 < 0) goto LAB_00151350;
    pcStackY_90 = (code *)0x150fde;
    uv_fs_req_cleanup(&open_req1);
    loop = (uv_fs_t *)0x0;
    pcStackY_90 = (code *)0x150ff4;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar1 != 0) goto LAB_00151355;
    pcStackY_90 = (code *)0x151008;
    uv_fs_req_cleanup(&close_req);
    pcStackY_90 = (code *)0x15102b;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_scandir(::loop,&scandir_req,"test_dir",0,scandir_cb);
    if (iVar1 != 0) goto LAB_0015135a;
    pcStackY_90 = (code *)0x151041;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (scandir_cb_count != 1) goto LAB_0015135f;
    loop = (uv_fs_t *)0x0;
    pcStackY_90 = (code *)0x151068;
    iVar1 = uv_fs_scandir((uv_loop_t *)0x0,&scandir_req,"test_dir",0,(uv_fs_cb)0x0);
    if (iVar1 != 2) goto LAB_00151364;
    if (scandir_req.result != 2) goto LAB_00151369;
    if (scandir_req.ptr == (void *)0x0) goto LAB_0015136e;
    pcStackY_90 = (code *)0x15109c;
    iVar1 = uv_fs_scandir_next(&scandir_req,&uStackY_88);
    if (iVar1 != -0xfff) {
      puVar2 = (uv_loop_t *)0x192f38;
      unaff_R14 = &scandir_req;
      unaff_R12 = "file2";
      do {
        loop = (uv_fs_t *)uStackY_88.name;
        pcVar3 = "file1";
        pcStackY_90 = (code *)0x1510ca;
        iVar1 = strcmp(uStackY_88.name,"file1");
        if (iVar1 != 0) {
          pcVar3 = "file2";
          pcStackY_90 = (code *)0x1510d9;
          iVar1 = strcmp((char *)loop,"file2");
          if (iVar1 != 0) {
            pcStackY_90 = (code *)0x15133c;
            run_test_fs_async_dir_cold_11();
            unaff_R15 = &uStackY_88;
            goto LAB_0015133c;
          }
        }
        dent.name = (char *)(ulong)uStackY_88.type;
        pcStackY_90 = (code *)0x1510ea;
        dent._8_8_ = pcVar3;
        assert_is_file_type(dent);
        pcStackY_90 = (code *)0x1510f5;
        iVar1 = uv_fs_scandir_next(&scandir_req,&uStackY_88);
        unaff_R15 = &uStackY_88;
      } while (iVar1 != -0xfff);
    }
    loop = &scandir_req;
    pcStackY_90 = (code *)0x151108;
    uv_fs_req_cleanup(&scandir_req);
    if (scandir_req.ptr != (void *)0x0) goto LAB_00151373;
    pcStackY_90 = (code *)0x151137;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_stat(::loop,&stat_req,"test_dir",stat_cb);
    if (iVar1 != 0) goto LAB_00151378;
    pcStackY_90 = (code *)0x15114d;
    uv_run(::loop,UV_RUN_DEFAULT);
    pcStackY_90 = (code *)0x15116e;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_stat(::loop,&stat_req,"test_dir/",stat_cb);
    if (iVar1 != 0) goto LAB_0015137d;
    pcStackY_90 = (code *)0x151184;
    uv_run(::loop,UV_RUN_DEFAULT);
    pcStackY_90 = (code *)0x1511a5;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_lstat(::loop,&stat_req,"test_dir",stat_cb);
    if (iVar1 != 0) goto LAB_00151382;
    pcStackY_90 = (code *)0x1511bb;
    uv_run(::loop,UV_RUN_DEFAULT);
    pcStackY_90 = (code *)0x1511dc;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_lstat(::loop,&stat_req,"test_dir/",stat_cb);
    if (iVar1 != 0) goto LAB_00151387;
    pcStackY_90 = (code *)0x1511f2;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (stat_cb_count != 4) goto LAB_0015138c;
    pcStackY_90 = (code *)0x151220;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_unlink(::loop,&unlink_req,"test_dir/file1",unlink_cb);
    if (iVar1 != 0) goto LAB_00151391;
    pcStackY_90 = (code *)0x151236;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (unlink_cb_count != 1) goto LAB_00151396;
    pcStackY_90 = (code *)0x151264;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_unlink(::loop,&unlink_req,"test_dir/file2",unlink_cb);
    if (iVar1 != 0) goto LAB_0015139b;
    pcStackY_90 = (code *)0x15127a;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (unlink_cb_count != 2) goto LAB_001513a0;
    pcStackY_90 = (code *)0x1512a8;
    loop = (uv_fs_t *)::loop;
    iVar1 = uv_fs_rmdir(::loop,&rmdir_req,"test_dir",rmdir_cb);
    if (iVar1 != 0) goto LAB_001513a5;
    pcStackY_90 = (code *)0x1512be;
    loop = (uv_fs_t *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (rmdir_cb_count != 1) goto LAB_001513aa;
    pcStackY_90 = (code *)0x1512d7;
    unlink("test_dir/file1");
    pcStackY_90 = (code *)0x1512e3;
    unlink("test_dir/file2");
    pcStackY_90 = (code *)0x1512ef;
    rmdir("test_dir");
    pcStackY_90 = (code *)0x1512f4;
    puVar2 = uv_default_loop();
    pcStackY_90 = (code *)0x151308;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    pcStackY_90 = (code *)0x151312;
    uv_run(puVar2,UV_RUN_DEFAULT);
    pcStackY_90 = (code *)0x151317;
    loop = (uv_fs_t *)uv_default_loop();
    pcStackY_90 = (code *)0x15131f;
    iVar1 = uv_loop_close((uv_loop_t *)loop);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
LAB_0015133c:
    pcStackY_90 = (code *)0x151341;
    run_test_fs_async_dir_cold_1();
LAB_00151341:
    pcStackY_90 = (code *)0x151346;
    run_test_fs_async_dir_cold_2();
LAB_00151346:
    pcStackY_90 = (code *)0x15134b;
    run_test_fs_async_dir_cold_3();
LAB_0015134b:
    pcStackY_90 = (code *)0x151350;
    run_test_fs_async_dir_cold_4();
LAB_00151350:
    pcStackY_90 = (code *)0x151355;
    run_test_fs_async_dir_cold_5();
LAB_00151355:
    pcStackY_90 = (code *)0x15135a;
    run_test_fs_async_dir_cold_6();
LAB_0015135a:
    pcStackY_90 = (code *)0x15135f;
    run_test_fs_async_dir_cold_7();
LAB_0015135f:
    pcStackY_90 = (code *)0x151364;
    run_test_fs_async_dir_cold_8();
LAB_00151364:
    pcStackY_90 = (code *)0x151369;
    run_test_fs_async_dir_cold_9();
LAB_00151369:
    pcStackY_90 = (code *)0x15136e;
    run_test_fs_async_dir_cold_10();
LAB_0015136e:
    pcStackY_90 = (code *)0x151373;
    run_test_fs_async_dir_cold_25();
LAB_00151373:
    pcStackY_90 = (code *)0x151378;
    run_test_fs_async_dir_cold_12();
LAB_00151378:
    pcStackY_90 = (code *)0x15137d;
    run_test_fs_async_dir_cold_13();
LAB_0015137d:
    pcStackY_90 = (code *)0x151382;
    run_test_fs_async_dir_cold_14();
LAB_00151382:
    pcStackY_90 = (code *)0x151387;
    run_test_fs_async_dir_cold_15();
LAB_00151387:
    pcStackY_90 = (code *)0x15138c;
    run_test_fs_async_dir_cold_16();
LAB_0015138c:
    pcStackY_90 = (code *)0x151391;
    run_test_fs_async_dir_cold_17();
LAB_00151391:
    pcStackY_90 = (code *)0x151396;
    run_test_fs_async_dir_cold_18();
LAB_00151396:
    pcStackY_90 = (code *)0x15139b;
    run_test_fs_async_dir_cold_19();
LAB_0015139b:
    pcStackY_90 = (code *)0x1513a0;
    run_test_fs_async_dir_cold_20();
LAB_001513a0:
    pcStackY_90 = (code *)0x1513a5;
    run_test_fs_async_dir_cold_21();
LAB_001513a5:
    pcStackY_90 = (code *)0x1513aa;
    run_test_fs_async_dir_cold_22();
LAB_001513aa:
    pcStackY_90 = (code *)0x1513af;
    run_test_fs_async_dir_cold_23();
  }
  pcStackY_90 = mkdir_cb;
  run_test_fs_async_dir_cold_24();
  if (loop == &mkdir_req) {
    if (mkdir_req.fs_type != UV_FS_MKDIR) goto LAB_0015140e;
    if (mkdir_req.result != 0) goto LAB_00151413;
    mkdir_cb_count = mkdir_cb_count + 1;
    if (mkdir_req.path == (char *)0x0) goto LAB_00151418;
    if (mkdir_req.path[8] == '\0' && *(long *)mkdir_req.path == 0x7269645f74736574) {
      uv_fs_req_cleanup(&mkdir_req);
      return;
    }
  }
  else {
    pcStackY_98 = (code *)0x15140e;
    mkdir_cb_cold_1();
LAB_0015140e:
    pcStackY_98 = (code *)0x151413;
    mkdir_cb_cold_2();
LAB_00151413:
    pcStackY_98 = (code *)0x151418;
    mkdir_cb_cold_3();
LAB_00151418:
    pcStackY_98 = (code *)0x15141d;
    mkdir_cb_cold_5();
  }
  pcStackY_98 = scandir_cb;
  mkdir_cb_cold_4();
  puStackY_b8 = puVar2;
  pcStackY_b0 = unaff_R12;
  puStackY_a0 = unaff_R14;
  pcStackY_98 = (code *)unaff_R15;
  if (loop == &scandir_req) {
    puVar4 = loop;
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_00151529;
    if (scandir_req.result != 2) goto LAB_0015152e;
    if (scandir_req.ptr == (void *)0x0) goto LAB_00151533;
    puVar4 = &scandir_req;
    iVar1 = uv_fs_scandir_next(&scandir_req,&uStackY_c8);
    loop = (uv_fs_t *)uStackY_c8.name;
    while (iVar1 != -0xfff) {
      pcVar3 = "file1";
      uStackY_c8.name = (char *)loop;
      iVar1 = strcmp((char *)loop,"file1");
      if (iVar1 != 0) {
        pcVar3 = "file2";
        iVar1 = strcmp((char *)loop,"file2");
        if (iVar1 != 0) {
          scandir_cb_cold_4();
          goto LAB_00151524;
        }
      }
      dent_00.name = (char *)(ulong)uStackY_c8.type;
      dent_00._8_8_ = pcVar3;
      assert_is_file_type(dent_00);
      puVar4 = &scandir_req;
      iVar1 = uv_fs_scandir_next(&scandir_req,&uStackY_c8);
      loop = (uv_fs_t *)uStackY_c8.name;
    }
    scandir_cb_count = scandir_cb_count + 1;
    if ((long *)scandir_req.path == (long *)0x0) goto LAB_00151538;
    if ((char)*(long *)((long)scandir_req.path + 8) != '\0' ||
        *(long *)scandir_req.path != 0x7269645f74736574) goto LAB_0015153d;
    puVar4 = &scandir_req;
    uv_fs_req_cleanup(&scandir_req);
    if (scandir_req.ptr == (void *)0x0) {
      return;
    }
  }
  else {
LAB_00151524:
    scandir_cb_cold_1();
    puVar4 = loop;
LAB_00151529:
    scandir_cb_cold_2();
LAB_0015152e:
    scandir_cb_cold_3();
LAB_00151533:
    scandir_cb_cold_8();
LAB_00151538:
    scandir_cb_cold_7();
LAB_0015153d:
    scandir_cb_cold_5();
  }
  scandir_cb_cold_6();
  if ((uint)puVar4 < 2) {
    return;
  }
  assert_is_file_type_cold_1();
  if (puVar4 == &stat_req) {
    if ((stat_req.fs_type & ~UV_FS_OPEN) != UV_FS_STAT) goto LAB_001515a5;
    if (stat_req.result != 0) goto LAB_001515aa;
    if (stat_req.ptr == (void *)0x0) goto LAB_001515af;
    stat_cb_count = stat_cb_count + 1;
    puVar4 = &stat_req;
    uv_fs_req_cleanup(&stat_req);
    if (stat_req.ptr == (void *)0x0) {
      return;
    }
  }
  else {
    stat_cb_cold_1();
LAB_001515a5:
    stat_cb_cold_2();
LAB_001515aa:
    stat_cb_cold_3();
LAB_001515af:
    stat_cb_cold_5();
  }
  stat_cb_cold_4();
  if (puVar4 == &unlink_req) {
    if (unlink_req.fs_type != UV_FS_UNLINK) goto LAB_001515f1;
    if (unlink_req.result == 0) {
      unlink_cb_count = unlink_cb_count + 1;
      uv_fs_req_cleanup(&unlink_req);
      return;
    }
  }
  else {
    unlink_cb_cold_1();
LAB_001515f1:
    unlink_cb_cold_2();
  }
  unlink_cb_cold_3();
  if (puVar4 == &rmdir_req) {
    if (rmdir_req.fs_type != UV_FS_RMDIR) goto LAB_00151655;
    if (rmdir_req.result != 0) goto LAB_0015165a;
    rmdir_cb_count = rmdir_cb_count + 1;
    if (rmdir_req.path != (char *)0x0) {
      if (rmdir_req.path[8] == '\0' && *(long *)rmdir_req.path == 0x7269645f74736574) {
        uv_fs_req_cleanup(&rmdir_req);
        return;
      }
      goto LAB_00151664;
    }
  }
  else {
    rmdir_cb_cold_1();
LAB_00151655:
    rmdir_cb_cold_2();
LAB_0015165a:
    rmdir_cb_cold_3();
  }
  rmdir_cb_cold_5();
LAB_00151664:
  rmdir_cb_cold_4();
  test_sendfile(sendfile_setup,sendfile_cb,0x1000a);
  return;
}

Assistant:

static void rename_cb(uv_fs_t* req) {
  ASSERT(req == &rename_req);
  ASSERT(req->fs_type == UV_FS_RENAME);
  ASSERT(req->result == 0);
  rename_cb_count++;
  uv_fs_req_cleanup(req);
}